

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O0

bool __thiscall JFSON::Json::operator<(Json *this,Json *other)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  element_type *peVar5;
  Json *other_local;
  Json *this_local;
  
  bVar1 = std::operator==(&this->m_ptr,&other->m_ptr);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    peVar4 = std::__shared_ptr_access<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
    iVar2 = (**peVar4->_vptr_JsonValue)();
    peVar4 = std::__shared_ptr_access<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)other);
    iVar3 = (**peVar4->_vptr_JsonValue)();
    if (iVar2 == iVar3) {
      peVar4 = std::__shared_ptr_access<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      peVar5 = std::__shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>::get
                         ((__shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2> *)other);
      iVar2 = (*peVar4->_vptr_JsonValue[2])(peVar4,peVar5);
      this_local._7_1_ = (bool)((byte)iVar2 & 1);
    }
    else {
      peVar4 = std::__shared_ptr_access<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this);
      iVar2 = (**peVar4->_vptr_JsonValue)();
      peVar4 = std::__shared_ptr_access<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)other);
      iVar3 = (**peVar4->_vptr_JsonValue)();
      this_local._7_1_ = iVar2 < iVar3;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Json::operator< (const Json &other) const {
    if (m_ptr == other.m_ptr)
        return false;
    if (m_ptr->type() != other.m_ptr->type())
        return m_ptr->type() < other.m_ptr->type();

    return m_ptr->less(other.m_ptr.get());
}